

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O0

bool testMethod_substr_AtStart(String *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  size_type sVar6;
  string *psVar7;
  char *substr_c_1;
  String substr_1;
  char *substr_c;
  undefined1 local_38 [8];
  String substr;
  String *str_local;
  
  substr.view_._M_str = (char *)str;
  cm::String::substr((String *)local_38,str,0,2);
  pcVar3 = cm::String::data((String *)local_38);
  pcVar4 = cm::String::data(str);
  if (pcVar3 == pcVar4) {
    sVar6 = cm::String::size((String *)local_38);
    if (sVar6 == 2) {
      substr_1.view_._M_str = cm::String::c_str((String *)local_38);
      iVar2 = strcmp(substr_1.view_._M_str,"ab");
      pcVar3 = substr_1.view_._M_str;
      if (iVar2 == 0) {
        pcVar4 = cm::String::data(str);
        if (pcVar3 == pcVar4) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(substr_c != str.data()) failed on line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x335);
          std::operator<<(poVar5,"\n");
          str_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
          pcVar3 = cm::String::data((String *)local_38);
          pcVar4 = cm::String::data(str);
          if (pcVar3 == pcVar4) {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(substr.data() != str.data()) failed on line ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x336);
            std::operator<<(poVar5,"\n");
            str_local._7_1_ = 0;
            bVar1 = true;
          }
          else {
            sVar6 = cm::String::size((String *)local_38);
            if (sVar6 == 2) {
              bVar1 = cm::String::is_stable((String *)local_38);
              if (bVar1) {
                psVar7 = cm::String::str_abi_cxx11_((String *)local_38);
                bVar1 = std::operator==(psVar7,"ab");
                if (bVar1) {
                  bVar1 = cm::String::is_stable((String *)local_38);
                  if (bVar1) {
                    pcVar3 = cm::String::data((String *)local_38);
                    if (pcVar3 == substr_1.view_._M_str) {
                      sVar6 = cm::String::size((String *)local_38);
                      if (sVar6 == 2) {
                        pcVar3 = cm::String::c_str((String *)local_38);
                        if (pcVar3 == substr_1.view_._M_str) {
                          bVar1 = false;
                        }
                        else {
                          poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(substr.c_str() == substr_c) failed on line "
                                                  );
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33f);
                          std::operator<<(poVar5,"\n");
                          str_local._7_1_ = 0;
                          bVar1 = true;
                        }
                      }
                      else {
                        poVar5 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(substr.size() == 2) failed on line ");
                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33e);
                        std::operator<<(poVar5,"\n");
                        str_local._7_1_ = 0;
                        bVar1 = true;
                      }
                    }
                    else {
                      poVar5 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(substr.data() == substr_c) failed on line "
                                              );
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33d);
                      std::operator<<(poVar5,"\n");
                      str_local._7_1_ = 0;
                      bVar1 = true;
                    }
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(substr.is_stable()) failed on line ");
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33c);
                    std::operator<<(poVar5,"\n");
                    str_local._7_1_ = 0;
                    bVar1 = true;
                  }
                }
                else {
                  poVar5 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(substr.str() == \"ab\") failed on line ");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33b);
                  std::operator<<(poVar5,"\n");
                  str_local._7_1_ = 0;
                  bVar1 = true;
                }
              }
              else {
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(substr.is_stable()) failed on line ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x338);
                std::operator<<(poVar5,"\n");
                str_local._7_1_ = 0;
                bVar1 = true;
              }
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(substr.size() == 2) failed on line ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x337);
              std::operator<<(poVar5,"\n");
              str_local._7_1_ = 0;
              bVar1 = true;
            }
          }
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(std::strcmp(substr_c, \"ab\") == 0) failed on line ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x334);
        std::operator<<(poVar5,"\n");
        str_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(substr.size() == 2) failed on line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x330);
      std::operator<<(poVar5,"\n");
      str_local._7_1_ = 0;
      bVar1 = true;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(substr.data() == str.data()) failed on line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x32f);
    std::operator<<(poVar5,"\n");
    str_local._7_1_ = 0;
    bVar1 = true;
  }
  cm::String::~String((String *)local_38);
  if (!bVar1) {
    cm::String::substr((String *)&substr_c_1,str,0,2);
    pcVar3 = cm::String::data((String *)&substr_c_1);
    pcVar4 = cm::String::data(str);
    if (pcVar3 == pcVar4) {
      sVar6 = cm::String::size((String *)&substr_c_1);
      if (sVar6 == 2) {
        bVar1 = cm::String::is_stable((String *)&substr_c_1);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!substr.is_stable()) failed on line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x346);
          std::operator<<(poVar5,"\n");
          str_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
          psVar7 = cm::String::str_abi_cxx11_((String *)&substr_c_1);
          bVar1 = std::operator==(psVar7,"ab");
          if (bVar1) {
            bVar1 = cm::String::is_stable((String *)&substr_c_1);
            if (bVar1) {
              pcVar3 = cm::String::data((String *)&substr_c_1);
              pcVar4 = cm::String::data(str);
              if (pcVar3 == pcVar4) {
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(substr.data() != str.data()) failed on line ")
                ;
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x34b);
                std::operator<<(poVar5,"\n");
                str_local._7_1_ = 0;
                bVar1 = true;
              }
              else {
                sVar6 = cm::String::size((String *)&substr_c_1);
                if (sVar6 == 2) {
                  pcVar3 = cm::String::c_str((String *)&substr_c_1);
                  pcVar4 = cm::String::data(str);
                  if (pcVar3 == pcVar4) {
                    poVar5 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(substr.c_str() != str.data()) failed on line "
                                            );
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x34d);
                    std::operator<<(poVar5,"\n");
                    str_local._7_1_ = 0;
                    bVar1 = true;
                  }
                  else {
                    pcVar3 = cm::String::c_str((String *)&substr_c_1);
                    iVar2 = strcmp(pcVar3,"ab");
                    if (iVar2 == 0) {
                      pcVar4 = cm::String::data((String *)&substr_c_1);
                      if (pcVar3 == pcVar4) {
                        sVar6 = cm::String::size((String *)&substr_c_1);
                        if (sVar6 == 2) {
                          bVar1 = cm::String::is_stable((String *)&substr_c_1);
                          if (bVar1) {
                            bVar1 = false;
                          }
                          else {
                            poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(substr.is_stable()) failed on line ")
                            ;
                            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x354);
                            std::operator<<(poVar5,"\n");
                            str_local._7_1_ = 0;
                            bVar1 = true;
                          }
                        }
                        else {
                          poVar5 = std::operator<<((ostream *)&std::cout,
                                                   "ASSERT_TRUE(substr.size() == 2) failed on line "
                                                  );
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x353);
                          std::operator<<(poVar5,"\n");
                          str_local._7_1_ = 0;
                          bVar1 = true;
                        }
                      }
                      else {
                        poVar5 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(substr_c == substr.data()) failed on line "
                                                );
                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x352);
                        std::operator<<(poVar5,"\n");
                        str_local._7_1_ = 0;
                        bVar1 = true;
                      }
                    }
                    else {
                      poVar5 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(std::strcmp(substr_c, \"ab\") == 0) failed on line "
                                              );
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x351);
                      std::operator<<(poVar5,"\n");
                      str_local._7_1_ = 0;
                      bVar1 = true;
                    }
                  }
                }
                else {
                  poVar5 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(substr.size() == 2) failed on line ");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x34c);
                  std::operator<<(poVar5,"\n");
                  str_local._7_1_ = 0;
                  bVar1 = true;
                }
              }
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(substr.is_stable()) failed on line ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x34a);
              std::operator<<(poVar5,"\n");
              str_local._7_1_ = 0;
              bVar1 = true;
            }
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(substr.str() == \"ab\") failed on line ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x349);
            std::operator<<(poVar5,"\n");
            str_local._7_1_ = 0;
            bVar1 = true;
          }
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(substr.size() == 2) failed on line ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x345);
        std::operator<<(poVar5,"\n");
        str_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(substr.data() == str.data()) failed on line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x344);
      std::operator<<(poVar5,"\n");
      str_local._7_1_ = 0;
      bVar1 = true;
    }
    cm::String::~String((String *)&substr_c_1);
    if (!bVar1) {
      str_local._7_1_ = 1;
    }
  }
  return (bool)(str_local._7_1_ & 1);
}

Assistant:

static bool testMethod_substr_AtStart(cm::String str)
{
  {
    cm::String substr = str.substr(0, 2);
    ASSERT_TRUE(substr.data() == str.data());
    ASSERT_TRUE(substr.size() == 2);

    // c_str() not at the end of the buffer internally mutates.
    const char* substr_c = substr.c_str();
    ASSERT_TRUE(std::strcmp(substr_c, "ab") == 0);
    ASSERT_TRUE(substr_c != str.data());
    ASSERT_TRUE(substr.data() != str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.is_stable());

    // str() does not need to internally mutate after c_str() did so
    ASSERT_TRUE(substr.str() == "ab");
    ASSERT_TRUE(substr.is_stable());
    ASSERT_TRUE(substr.data() == substr_c);
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.c_str() == substr_c);
  }

  {
    cm::String substr = str.substr(0, 2);
    ASSERT_TRUE(substr.data() == str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(!substr.is_stable());

    // str() internally mutates.
    ASSERT_TRUE(substr.str() == "ab");
    ASSERT_TRUE(substr.is_stable());
    ASSERT_TRUE(substr.data() != str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.c_str() != str.data());

    // c_str() does not internally after str() did so
    const char* substr_c = substr.c_str();
    ASSERT_TRUE(std::strcmp(substr_c, "ab") == 0);
    ASSERT_TRUE(substr_c == substr.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.is_stable());
  }

  return true;
}